

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Reals __thiscall Omega_h::Mesh::ask_qualities(Mesh *this)

{
  bool bVar1;
  Int IVar2;
  uint uVar3;
  void *extraout_RDX;
  Mesh *in_RSI;
  Reals RVar4;
  allocator local_b9;
  string local_b8 [32];
  Read<double> local_98;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  Reals qualities;
  allocator local_39;
  string local_38 [40];
  Mesh *this_local;
  
  this_local = this;
  IVar2 = dim(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"quality",&local_39);
  bVar1 = has_tag(in_RSI,IVar2,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    measure_qualities((Omega_h *)local_60,in_RSI);
    IVar2 = dim(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"quality",&local_81);
    Read<double>::Read(&local_98,(Read<double> *)local_60);
    add_tag<double>(in_RSI,IVar2,(string *)local_80,1,&local_98,false);
    Read<double>::~Read(&local_98);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    Read<double>::~Read((Read<double> *)local_60);
  }
  uVar3 = dim(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"quality",&local_b9);
  get_array<double>(this,(Int)in_RSI,(string *)(ulong)uVar3);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals Mesh::ask_qualities() {
  if (!has_tag(dim(), "quality")) {
    auto qualities = measure_qualities(this);
    add_tag(dim(), "quality", 1, qualities);
  }
  return get_array<Real>(dim(), "quality");
}